

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O0

void __thiscall FPatchTexture::MakeTexture(FPatchTexture *this)

{
  ushort uVar1;
  int iVar2;
  void *pvVar3;
  BYTE *pBVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  int local_19c;
  int i;
  BYTE *in_1;
  BYTE *out_1;
  int len;
  int top;
  column_t *column;
  BYTE *outtop;
  int numpix;
  byte *pbStack_160;
  int y;
  BYTE *in;
  BYTE *out;
  patch_t *patch;
  FMemLump lump;
  int x;
  column_t *maxcol;
  undefined1 local_118 [4];
  int numspans;
  BYTE remaptable [256];
  BYTE *remap;
  FPatchTexture *this_local;
  
  FWadCollection::ReadLump((FWadCollection *)&patch,0xdb0460);
  pvVar3 = FMemLump::GetMem((FMemLump *)&patch);
  iVar2 = FWadCollection::LumpLength(&Wads,(this->super_FTexture).SourceLump);
  if ((*(ushort *)&(this->super_FTexture).field_0x31 >> 1 & 1) == 0) {
    remaptable[0xf8] = 'p';
    remaptable[0xf9] = 'r';
    remaptable[0xfa] = 0xd7;
    remaptable[0xfb] = '\0';
    remaptable[0xfc] = '\0';
    remaptable[0xfd] = '\0';
    remaptable[0xfe] = '\0';
    remaptable[0xff] = '\0';
  }
  else {
    memcpy(local_118,GPalette.Remap,0x100);
    local_118[0] = 0;
    remaptable._248_8_ = local_118;
  }
  if ((this->hackflag & 1U) == 0) {
    uVar6 = (uint)(this->super_FTexture).Height;
    iVar5 = ((this->super_FTexture).Width * uVar6 +
            (1 << ((this->super_FTexture).HeightBits & 0x1f))) - uVar6;
    pBVar4 = (BYTE *)operator_new__((long)iVar5);
    this->Pixels = pBVar4;
    memset(this->Pixels,0,(long)iVar5);
    for (lump.Block.Chars._4_4_ = 0;
        lump.Block.Chars._4_4_ < (int)(uint)(this->super_FTexture).Width;
        lump.Block.Chars._4_4_ = lump.Block.Chars._4_4_ + 1) {
      pBVar4 = this->Pixels;
      uVar1 = (this->super_FTexture).Height;
      _len = (byte *)((long)pvVar3 +
                     (ulong)*(uint *)((long)pvVar3 + (long)lump.Block.Chars._4_4_ * 4 + 8));
      out_1._4_4_ = 0xffffffff;
      while( true ) {
        bVar7 = false;
        if (_len < (byte *)((long)pvVar3 + (long)iVar2 + -3)) {
          bVar7 = *_len != 0xff;
        }
        if (!bVar7) break;
        if ((int)out_1._4_4_ < (int)(uint)*_len) {
          out_1._4_4_ = (uint)*_len;
        }
        else {
          out_1._4_4_ = *_len + out_1._4_4_;
        }
        out_1._0_4_ = (uint)_len[1];
        if ((uint)out_1 != 0) {
          if ((int)(uint)(this->super_FTexture).Height < (int)(out_1._4_4_ + (uint)out_1)) {
            out_1._0_4_ = (this->super_FTexture).Height - out_1._4_4_;
          }
          if (0 < (int)(uint)out_1) {
            for (local_19c = 0; local_19c < (int)(uint)out_1; local_19c = local_19c + 1) {
              pBVar4[(long)local_19c +
                     (long)(int)out_1._4_4_ + (long)(int)(lump.Block.Chars._4_4_ * (uint)uVar1)] =
                   *(BYTE *)(remaptable._248_8_ + (ulong)_len[(long)local_19c + 3]);
            }
          }
        }
        _len = _len + (long)(int)(uint)_len[1] + 4;
      }
    }
  }
  else {
    pBVar4 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                               (uint)(this->super_FTexture).Height));
    this->Pixels = pBVar4;
    lump.Block.Chars._4_4_ = 0;
    in = this->Pixels;
    for (; lump.Block.Chars._4_4_ < (int)(uint)(this->super_FTexture).Width;
        lump.Block.Chars._4_4_ = lump.Block.Chars._4_4_ + 1) {
      pbStack_160 = (byte *)((long)pvVar3 +
                            (ulong)*(uint *)((long)pvVar3 + (long)lump.Block.Chars._4_4_ * 4 + 8) +
                            3);
      for (numpix = (int)(this->super_FTexture).Height; 0 < numpix; numpix = numpix + -1) {
        *in = *(BYTE *)(remaptable._248_8_ + (ulong)*pbStack_160);
        in = in + 1;
        pbStack_160 = pbStack_160 + 1;
      }
    }
  }
  FMemLump::~FMemLump((FMemLump *)&patch);
  return;
}

Assistant:

void FPatchTexture::MakeTexture ()
{
	BYTE *remap, remaptable[256];
	int numspans;
	const column_t *maxcol;
	int x;

	FMemLump lump = Wads.ReadLump (SourceLump);
	const patch_t *patch = (const patch_t *)lump.GetMem();

	maxcol = (const column_t *)((const BYTE *)patch + Wads.LumpLength (SourceLump) - 3);

	// Check for badly-sized patches
#if 0	// Such textures won't be created so there's no need to check here
	if (LittleShort(patch->width) <= 0 || LittleShort(patch->height) <= 0)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s has a non-positive size.\n", Name);
	}
	else if (LittleShort(patch->width) > 2048 || LittleShort(patch->height) > 2048)
	{
		lump = Wads.ReadLump ("-BADPATC");
		patch = (const patch_t *)lump.GetMem();
		Printf (PRINT_BOLD, "Patch %s is too big.\n", Name);
	}
#endif

	if (bNoRemap0)
	{
		memcpy (remaptable, GPalette.Remap, 256);
		remaptable[0] = 0;
		remap = remaptable;
	}
	else
	{
		remap = GPalette.Remap;
	}


	if (hackflag)
	{
		Pixels = new BYTE[Width * Height];
		BYTE *out;

		// Draw the image to the buffer
		for (x = 0, out = Pixels; x < Width; ++x)
		{
			const BYTE *in = (const BYTE *)patch + LittleLong(patch->columnofs[x]) + 3;

			for (int y = Height; y > 0; --y)
			{
				*out = remap[*in];
				out++, in++;
			}
		}
		return;
	}

	// Add a little extra space at the end if the texture's height is not
	// a power of 2, in case somebody accidentally makes it repeat vertically.
	int numpix = Width * Height + (1 << HeightBits) - Height;

	numspans = Width;

	Pixels = new BYTE[numpix];
	memset (Pixels, 0, numpix);

	// Draw the image to the buffer
	for (x = 0; x < Width; ++x)
	{
		BYTE *outtop = Pixels + x*Height;
		const column_t *column = (const column_t *)((const BYTE *)patch + LittleLong(patch->columnofs[x]));
		int top = -1;

		while (column < maxcol && column->topdelta != 0xFF)
		{
			if (column->topdelta <= top)
			{
				top += column->topdelta;
			}
			else
			{
				top = column->topdelta;
			}

			int len = column->length;
			BYTE *out = outtop + top;

			if (len != 0)
			{
				if (top + len > Height)	// Clip posts that extend past the bottom
				{
					len = Height - top;
				}
				if (len > 0)
				{
					numspans++;

					const BYTE *in = (const BYTE *)column + 3;
					for (int i = 0; i < len; ++i)
					{
						out[i] = remap[in[i]];
					}
				}
			}
			column = (const column_t *)((const BYTE *)column + column->length + 4);
		}
	}
}